

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O3

void __thiscall xray_re::xr_custom_object::save(xr_custom_object *this,xr_writer *w)

{
  float local_1c;
  
  xr_writer::w_raw_chunk(w,0xf906,&this->m_flags,4,false);
  xr_writer::open_chunk(w,0xf907);
  xr_writer::w_sz(w,&this->m_name);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0xf903);
  local_1c = (this->m_position).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_position).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_position).field_0.field_0.z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_rotation).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_rotation).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_rotation).field_0.field_0.z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_scale).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_scale).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->m_scale).field_0.field_0.z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xr_writer::close_chunk(w);
  if ((this->m_flags & 8) != 0) {
    if (this->m_motion == (xr_obj_motion *)0x0) {
      __assert_fail("m_motion",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                    ,0x56,"virtual void xray_re::xr_custom_object::save(xr_writer &) const");
    }
    xr_writer::open_chunk(w,0xf905);
    (*(this->m_motion->super_xr_motion)._vptr_xr_motion[3])(this->m_motion,w);
    xr_writer::close_chunk(w);
    xr_writer::w_raw_chunk(w,0xf908,&this->m_time,4,false);
  }
  return;
}

Assistant:

void xr_custom_object::save(xr_writer& w) const
{
	w.w_chunk(CUSTOMOBJECT_CHUNK_FLAGS, m_flags);
	w.w_chunk(CUSTOMOBJECT_CHUNK_NAME, m_name);

	w.open_chunk(CUSTOMOBJECT_CHUNK_XFORM);
	w.w_fvector3(m_position);
	w.w_fvector3(m_rotation);
	w.w_fvector3(m_scale);
	w.close_chunk();

	if (m_flags & COF_MOTIONABLE) {
		xr_assert(m_motion);
		w.open_chunk(CUSTOMOBJECT_CHUNK_MOTION);
		m_motion->save(w);
		w.close_chunk();

		w.w_chunk<float>(CUSTOMOBJECT_CHUNK_TIME, m_time);
	}
}